

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslconfiguration.cpp
# Opt level: O2

void __thiscall QSslConfiguration::setPeerVerifyMode(QSslConfiguration *this,PeerVerifyMode mode)

{
  QSslConfigurationPrivate *pQVar1;
  
  pQVar1 = QSharedDataPointer<QSslConfigurationPrivate>::operator->(&this->d);
  pQVar1->peerVerifyMode = mode;
  return;
}

Assistant:

void QSslConfiguration::setPeerVerifyMode(QSslSocket::PeerVerifyMode mode)
{
    d->peerVerifyMode = mode;
}